

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QDockAreaLayoutInfo::unplug(QDockAreaLayoutInfo *this,QList<int> *path)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  qsizetype qVar5;
  reference pQVar6;
  const_reference pQVar7;
  QDockAreaLayoutInfo *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int next;
  int prev;
  QDockAreaLayoutItem *item;
  QDockAreaLayoutItem *item_1;
  int index;
  qsizetype in_stack_ffffffffffffff88;
  QList<QDockAreaLayoutItem> *in_stack_ffffffffffffff90;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff98;
  qsizetype in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  QLayoutItem *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  piVar4 = QList<int>::first((QList<int> *)in_stack_ffffffffffffff90);
  iVar2 = *piVar4;
  qVar5 = QList<int>::size((QList<int> *)in_RSI);
  if (qVar5 < 2) {
    pQVar6 = QList<QDockAreaLayoutItem>::operator[]
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    iVar2 = QDockAreaLayoutInfo::prev
                      (in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    iVar3 = QDockAreaLayoutInfo::next
                      (in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    pQVar6->flags = pQVar6->flags | 1;
    if ((*(byte *)(in_RDI + 0xb) & 1) == 0) {
      if ((iVar2 != -1) &&
         (pQVar7 = QList<QDockAreaLayoutItem>::at
                             (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88),
         (pQVar7->flags & 1) == 0)) {
        pQVar6->pos = pQVar6->pos - *(int *)*in_RDI;
        pQVar6->size = *(int *)*in_RDI + pQVar6->size;
      }
      if ((iVar3 != -1) &&
         (pQVar7 = QList<QDockAreaLayoutItem>::at
                             (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88),
         (pQVar7->flags & 1) == 0)) {
        pQVar6->size = *(int *)*in_RDI + pQVar6->size;
      }
    }
    local_28 = pQVar6->widgetItem;
  }
  else {
    pQVar6 = QList<QDockAreaLayoutItem>::operator[]
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    QList<int>::mid((QList<int> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),(qsizetype)pQVar6,
                    in_stack_ffffffffffffffb0);
    local_28 = unplug(in_RSI,(QList<int> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
    QList<int>::~QList((QList<int> *)0x570cf8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

QLayoutItem *QDockAreaLayoutInfo::unplug(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());

    const int index = path.first();
    if (path.size() > 1) {
        QDockAreaLayoutItem &item = item_list[index];
        Q_ASSERT(item.subinfo != nullptr);
        return item.subinfo->unplug(path.mid(1));
    }

    QDockAreaLayoutItem &item = item_list[index];
    int prev = this->prev(index);
    int next = this->next(index);

    Q_ASSERT(!(item.flags & QDockAreaLayoutItem::GapItem));
    item.flags |= QDockAreaLayoutItem::GapItem;

#if QT_CONFIG(tabbar)
    if (tabbed) {
    } else
#endif
    {
        if (prev != -1 && !(item_list.at(prev).flags & QDockAreaLayoutItem::GapItem)) {
            item.pos -= *sep;
            item.size += *sep;
        }
        if (next != -1 && !(item_list.at(next).flags & QDockAreaLayoutItem::GapItem))
            item.size += *sep;
    }

    return item.widgetItem;
}